

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O2

void load_buffer_16x16(int16_t *input,__m128i *out,int stride,int flipud,int fliplr,int shift)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  int16_t *piVar3;
  long lVar4;
  int16_t *piVar5;
  int16_t *input_00;
  int16_t *input_01;
  __m128i in [64];
  int16_t *local_448;
  int16_t *local_440;
  longlong local_438 [32];
  longlong local_338 [32];
  longlong local_238 [32];
  longlong local_138 [33];
  
  local_440 = input + 8;
  local_448 = input + stride * 8;
  piVar3 = input + (long)(stride * 8) + 8;
  piVar5 = input;
  if (flipud != 0) {
    piVar3 = local_440;
    local_440 = input + (long)(stride * 8) + 8;
    piVar5 = local_448;
    local_448 = input;
  }
  input_00 = piVar5;
  input_01 = piVar3;
  if (fliplr != 0) {
    input_00 = local_440;
    input_01 = local_448;
    local_448 = piVar3;
    local_440 = piVar5;
  }
  load_buffer_8x8(input_00,(__m128i *)local_438,stride,flipud,fliplr,shift);
  load_buffer_8x8(local_448,(__m128i *)local_238,stride,flipud,fliplr,shift);
  load_buffer_8x8(local_440,(__m128i *)local_338,stride,flipud,fliplr,shift);
  load_buffer_8x8(input_01,(__m128i *)local_138,stride,flipud,fliplr,shift);
  lVar4 = 0;
  do {
    uVar2 = *(undefined8 *)((long)local_438 + lVar4 + 8);
    puVar1 = (undefined8 *)((long)*out + lVar4 * 2);
    *puVar1 = *(undefined8 *)((long)local_438 + lVar4);
    puVar1[1] = uVar2;
    uVar2 = *(undefined8 *)((long)local_438 + lVar4 + 0x18);
    puVar1 = (undefined8 *)((long)out[1] + lVar4 * 2);
    *puVar1 = *(undefined8 *)((long)local_438 + lVar4 + 0x10);
    puVar1[1] = uVar2;
    uVar2 = *(undefined8 *)((long)local_338 + lVar4 + 8);
    puVar1 = (undefined8 *)((long)out[2] + lVar4 * 2);
    *puVar1 = *(undefined8 *)((long)local_338 + lVar4);
    puVar1[1] = uVar2;
    uVar2 = *(undefined8 *)((long)local_338 + lVar4 + 0x18);
    puVar1 = (undefined8 *)((long)out[3] + lVar4 * 2);
    *puVar1 = *(undefined8 *)((long)local_338 + lVar4 + 0x10);
    puVar1[1] = uVar2;
    lVar4 = lVar4 + 0x20;
  } while ((int)lVar4 != 0x100);
  lVar4 = 0;
  do {
    uVar2 = *(undefined8 *)((long)local_238 + lVar4 + 8);
    puVar1 = (undefined8 *)((long)out[0x20] + lVar4 * 2);
    *puVar1 = *(undefined8 *)((long)local_238 + lVar4);
    puVar1[1] = uVar2;
    uVar2 = *(undefined8 *)((long)local_238 + lVar4 + 0x18);
    puVar1 = (undefined8 *)((long)out[0x21] + lVar4 * 2);
    *puVar1 = *(undefined8 *)((long)local_238 + lVar4 + 0x10);
    puVar1[1] = uVar2;
    uVar2 = *(undefined8 *)((long)local_138 + lVar4 + 8);
    puVar1 = (undefined8 *)((long)out[0x22] + lVar4 * 2);
    *puVar1 = *(undefined8 *)((long)local_138 + lVar4);
    puVar1[1] = uVar2;
    uVar2 = *(undefined8 *)((long)local_138 + lVar4 + 0x18);
    puVar1 = (undefined8 *)((long)out[0x23] + lVar4 * 2);
    *puVar1 = *(undefined8 *)((long)local_138 + lVar4 + 0x10);
    puVar1[1] = uVar2;
    lVar4 = lVar4 + 0x20;
  } while ((int)lVar4 != 0x100);
  return;
}

Assistant:

static inline void load_buffer_16x16(const int16_t *input, __m128i *out,
                                     int stride, int flipud, int fliplr,
                                     int shift) {
  __m128i in[64];
  // Load 4 8x8 blocks
  const int16_t *topL = input;
  const int16_t *topR = input + 8;
  const int16_t *botL = input + 8 * stride;
  const int16_t *botR = input + 8 * stride + 8;

  const int16_t *tmp;

  if (flipud) {
    // Swap left columns
    tmp = topL;
    topL = botL;
    botL = tmp;
    // Swap right columns
    tmp = topR;
    topR = botR;
    botR = tmp;
  }

  if (fliplr) {
    // Swap top rows
    tmp = topL;
    topL = topR;
    topR = tmp;
    // Swap bottom rows
    tmp = botL;
    botL = botR;
    botR = tmp;
  }

  // load first 8 columns
  load_buffer_8x8(topL, &in[0], stride, flipud, fliplr, shift);
  load_buffer_8x8(botL, &in[32], stride, flipud, fliplr, shift);

  // load second 8 columns
  load_buffer_8x8(topR, &in[16], stride, flipud, fliplr, shift);
  load_buffer_8x8(botR, &in[48], stride, flipud, fliplr, shift);

  convert_8x8_to_16x16(in, out);
}